

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

bool __thiscall Assembler::isDirective(Assembler *this,string *line)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + line->_M_string_length);
  bVar2 = checkIfSection(this,&local_50);
  bVar3 = true;
  if (!bVar2) {
    pcVar1 = (line->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + line->_M_string_length);
    bVar2 = checkIfEnd(this,&local_70);
    bVar3 = true;
    if (!bVar2) {
      pcVar1 = (line->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + line->_M_string_length);
      bVar2 = checkIfEqu(this,&local_90);
      bVar3 = true;
      if (!bVar2) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (line->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + line->_M_string_length);
        bVar2 = checkIfExtern(this,&local_b0);
        bVar3 = true;
        if (!bVar2) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar1 = (line->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar1,pcVar1 + line->_M_string_length);
          bVar2 = checkIfGlobal(this,&local_d0);
          bVar3 = true;
          if (!bVar2) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar1 = (line->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar1,pcVar1 + line->_M_string_length);
            bVar2 = checkIfSkip(this,&local_f0);
            bVar3 = true;
            if (!bVar2) {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              pcVar1 = (line->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,pcVar1,pcVar1 + line->_M_string_length);
              bVar2 = checkIfWord(this,&local_110);
              bVar3 = true;
              if (!bVar2) {
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                pcVar1 = (line->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_130,pcVar1,pcVar1 + line->_M_string_length);
                bVar3 = checkIfLabel(this,&local_130);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool Assembler::isDirective(string line) {
    if (checkIfSection(line) || checkIfEnd(line) || checkIfEqu(line) || checkIfExtern(line)
        || checkIfGlobal(line) || checkIfSkip(line) || checkIfWord(line)
        || checkIfLabel(line))
        return true;
    else return false;
}